

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_ModuleTypePrinter_Test::TestBody(TypeTest_ModuleTypePrinter_Test *this)

{
  pointer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> **this_01;
  Printed PVar3;
  Printed PVar4;
  Printed PVar5;
  Printed PVar6;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  mapped_type *pmVar7;
  pointer *__ptr;
  char *in_R9;
  char *pcVar8;
  pointer puVar9;
  undefined1 auVar10 [16];
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  undefined1 auStack_828 [8];
  Module module;
  stringstream stream;
  undefined4 uStack_42c;
  undefined1 local_428 [8];
  size_type local_420;
  __node_base local_418;
  size_type sStack_410;
  _Prime_rehash_policy local_408;
  __node_base_ptr ap_Stack_3f8 [8];
  ios_base local_3b8 [264];
  AssertHelper local_2b0;
  ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator> printDefault;
  _Any_data local_240;
  code *local_230;
  Printed local_220;
  Printed local_1f8;
  Printed local_1d0;
  variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_1a8;
  undefined1 local_188 [8];
  ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
  printIndexed;
  IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> fallback;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  TypeBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  AssertHelper local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)this_00,2);
  ::wasm::TypeBuilder::createRecGroup((ulong)this_00,0);
  printIndexed.fallback = (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)0x2;
  fallback.defaultGenerator.funcCount = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&printIndexed.fallback;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
             &module.tagsMap._M_h._M_single_bucket,__l,(allocator_type *)&local_2b0);
  auStack_828 = (undefined1  [8])module.tagsMap._M_h._M_single_bucket;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_stream;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_428;
  module.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _stream = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_428 = (undefined1  [8])0x0;
  ::wasm::TypeBuilder::setHeapType
            ((ulong)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Struct *)0x0);
  if (auStack_828 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_828,
                    (long)module.exports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_828);
  }
  if (module.tagsMap._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(module.tagsMap._M_h._M_single_bucket,
                    (long)local_428 - (long)module.tagsMap._M_h._M_single_bucket);
  }
  printIndexed.fallback = (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)0x2;
  fallback.defaultGenerator.funcCount = 0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&printIndexed.fallback;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
             &module.tagsMap._M_h._M_single_bucket,__l_00,(allocator_type *)&local_2b0);
  auStack_828 = (undefined1  [8])module.tagsMap._M_h._M_single_bucket;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_stream;
  module.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_428;
  module.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _stream = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_428 = (undefined1  [8])0x0;
  ::wasm::TypeBuilder::setHeapType
            ((ulong)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Struct *)0x1);
  if (auStack_828 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_828,
                    (long)module.exports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_828);
  }
  if (module.tagsMap._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(module.tagsMap._M_h._M_single_bucket,
                    (long)local_428 - (long)module.tagsMap._M_h._M_single_bucket);
  }
  ::wasm::TypeBuilder::build();
  module.tagsMap._M_h._M_single_bucket =
       (__node_base_ptr)
       CONCAT71(module.tagsMap._M_h._M_single_bucket._1_7_,
                local_1a8.
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index == 0);
  _stream = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8.
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
      == 0) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    (&local_1a8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &fallback.names._M_h._M_single_bucket,__x);
    ::wasm::Module::Module((Module *)auStack_828);
    auVar10 = ::wasm::IString::interned(1,"A",0);
    _stream = auVar10._8_8_;
    module.tagsMap._M_h._M_single_bucket = auVar10._0_8_;
    local_428 = (undefined1  [8])ap_Stack_3f8;
    local_420 = 1;
    local_418._M_nxt = (_Hash_node_base *)0x0;
    sStack_410 = 0;
    local_408._M_max_load_factor = 1.0;
    local_408._4_4_ = 0;
    local_408._M_next_resize = 0;
    ap_Stack_3f8[0] = (__node_base_ptr)0x0;
    pmVar7 = std::__detail::
             _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&module.name.super_IString.str._M_str,
                          (key_type *)fallback.names._M_h._M_single_bucket);
    *(undefined4 *)&(pmVar7->name).super_IString.str._M_len =
         module.tagsMap._M_h._M_single_bucket._0_4_;
    *(undefined4 *)((long)&(pmVar7->name).super_IString.str._M_len + 4) =
         module.tagsMap._M_h._M_single_bucket._4_4_;
    *(undefined4 *)&(pmVar7->name).super_IString.str._M_str = _stream;
    *(undefined4 *)((long)&(pmVar7->name).super_IString.str._M_str + 4) = uStack_42c;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_move_assign(&(pmVar7->fieldNames)._M_h,
                     (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)local_428);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_428);
    printDefault.defaultGenerator.nameCache._M_h._M_single_bucket = (__node_base_ptr)&printDefault;
    printDefault.defaultGenerator.arrayCount =
         (size_t)&printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize;
    printDefault.wasm = (Module *)0x0;
    printDefault.defaultGenerator.funcCount = 0;
    printDefault.defaultGenerator.contCount = 0;
    printDefault.defaultGenerator.structCount = 0;
    printDefault.defaultGenerator.nameCache._M_h._M_buckets = (__buckets_ptr)0x1;
    printDefault.defaultGenerator.nameCache._M_h._M_bucket_count = 0;
    printDefault.defaultGenerator.nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    printDefault.defaultGenerator.nameCache._M_h._M_element_count._0_4_ = 0x3f800000;
    printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._4_4_ = 0;
    printDefault.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize = 0;
    local_2b0.data_ = (AssertHelperData *)auStack_828;
    std::__cxx11::stringstream::stringstream((stringstream *)&module.tagsMap._M_h._M_single_bucket);
    ::wasm::TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()((Printed *)&printDefault.fallback,
               (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)&local_2b0,(HeapType)(fallback.names._M_h._M_single_bucket)->_M_nxt);
    PVar3.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar3.typeID = (TypeID)auStack_828;
    PVar3.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar3.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar3.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar3);
    if (local_230 != (code *)0x0) {
      (*local_230)(&local_240,&local_240,__destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
              ((internal *)local_188,"stream.str()","\"(type $A (struct (field i32)))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &printIndexed.fallback,(char (*) [31])"(type $A (struct (field i32)))");
    psVar2 = &fallback.defaultGenerator.contCount;
    if (printIndexed.fallback != (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)psVar2)
    {
      operator_delete(printIndexed.fallback,fallback.defaultGenerator.contCount + 1);
    }
    if (local_188[0] == (internal)0x0) {
      testing::Message::Message((Message *)&printIndexed.fallback);
      if (printIndexed.wasm == (Module *)0x0) {
        puVar9 = (pointer)0x27a552;
      }
      else {
        puVar9 = ((printIndexed.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x91,(char *)puVar9);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_50,(Message *)&printIndexed.fallback);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if (printIndexed.fallback != (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)0x0)
      {
        (**(code **)(((printIndexed.fallback)->defaultGenerator).funcCount + 8))();
      }
    }
    if (printIndexed.wasm != (Module *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&printIndexed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   printIndexed.wasm);
    }
    puVar9 = (pointer)0x27a552;
    printIndexed.fallback = (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&printIndexed.fallback,"","");
    std::__cxx11::stringbuf::str((string *)&local_420);
    if (printIndexed.fallback != (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)psVar2)
    {
      operator_delete(printIndexed.fallback,fallback.defaultGenerator.contCount + 1);
    }
    ::wasm::TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
    operator()(&local_220,
               (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
                *)&local_2b0,(HeapType)fallback.names._M_h._M_single_bucket[1]._M_nxt);
    PVar4.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar4.typeID = (TypeID)auStack_828;
    PVar4.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar4.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar4.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar4);
    if (local_220.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_220.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_220.generateName,(_Any_data *)&local_220.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[38]>
              ((internal *)local_188,"stream.str()","\"(type $struct.0 (struct (field i32)))\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &printIndexed.fallback,(char (*) [38])"(type $struct.0 (struct (field i32)))");
    if (printIndexed.fallback != (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)psVar2)
    {
      operator_delete(printIndexed.fallback,fallback.defaultGenerator.contCount + 1);
    }
    if (local_188[0] == (internal)0x0) {
      testing::Message::Message((Message *)&printIndexed.fallback);
      if (printIndexed.wasm != (Module *)0x0) {
        puVar9 = ((printIndexed.wasm)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x95,(char *)puVar9);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_50,(Message *)&printIndexed.fallback);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
      if (printIndexed.fallback != (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)0x0)
      {
        (**(code **)(((printIndexed.fallback)->defaultGenerator).funcCount + 8))();
      }
    }
    if (printIndexed.wasm != (Module *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&printIndexed,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   printIndexed.wasm);
    }
    local_188 = (undefined1  [8])&printIndexed.defaultGenerator;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"");
    this_01 = &printIndexed.fallback;
    ::wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::
    IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
              ((IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)this_01,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &fallback.names._M_h._M_single_bucket,(DefaultTypeNameGenerator *)this_01,
               (string *)local_188);
    if (local_188 != (undefined1  [8])&printIndexed.defaultGenerator) {
      operator_delete((void *)local_188,printIndexed.defaultGenerator.funcCount + 1);
    }
    printIndexed.defaultGenerator.arrayCount =
         (size_t)&printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize;
    printIndexed.wasm = (Module *)0x0;
    printIndexed.defaultGenerator.funcCount = 0;
    printIndexed.defaultGenerator.contCount = 0;
    printIndexed.defaultGenerator.structCount = 0;
    printIndexed.defaultGenerator.nameCache._M_h._M_buckets = (__buckets_ptr)0x1;
    printIndexed.defaultGenerator.nameCache._M_h._M_bucket_count = 0;
    printIndexed.defaultGenerator.nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    printIndexed.defaultGenerator.nameCache._M_h._M_element_count._0_4_ = 0x3f800000;
    printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._4_4_ = 0;
    printIndexed.defaultGenerator.nameCache._M_h._M_rehash_policy._M_next_resize = 0;
    paVar1 = &local_50.field_2;
    pcVar8 = "";
    local_188 = (undefined1  [8])auStack_828;
    printIndexed.defaultGenerator.nameCache._M_h._M_single_bucket = (__node_base_ptr)this_01;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
    std::__cxx11::stringbuf::str((string *)&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ::wasm::
    TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_1f8,
                 (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_188,(HeapType)(fallback.names._M_h._M_single_bucket)->_M_nxt);
    PVar5.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar5.typeID = (TypeID)auStack_828;
    PVar5.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar5.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar5.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar5);
    if (local_1f8.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1f8.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_1f8.generateName,(_Any_data *)&local_1f8.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
              ((internal *)&builder,"stream.str()","\"(type $A (struct (field i32)))\"",&local_50,
               (char (*) [31])"(type $A (struct (field i32)))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x9d,pcVar8);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    pcVar8 = "";
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"","");
    std::__cxx11::stringbuf::str((string *)&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ::wasm::
    TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
    ::operator()(&local_1d0,
                 (TypeNameGeneratorBase<wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>_>
                  *)local_188,(HeapType)fallback.names._M_h._M_single_bucket[1]._M_nxt);
    PVar6.generateName.super__Function_base._M_functor._M_unused._M_object =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    PVar6.typeID = (TypeID)auStack_828;
    PVar6.generateName.super__Function_base._M_functor._8_8_ =
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    PVar6.generateName.super__Function_base._M_manager =
         (_Manager_type)
         module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    PVar6.generateName._M_invoker =
         (_Invoker_type)
         module.functions.
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ::wasm::operator<<((ostream *)local_428,PVar6);
    if (local_1d0.generateName.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1d0.generateName.super__Function_base._M_manager)
                ((_Any_data *)&local_1d0.generateName,(_Any_data *)&local_1d0.generateName,
                 __destroy_functor);
    }
    std::__cxx11::stringbuf::str();
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[31]>
              ((internal *)&builder,"stream.str()","\"(type $1 (struct (field i32)))\"",&local_50,
               (char (*) [31])"(type $1 (struct (field i32)))");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&local_50);
      if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = (local_60->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xa1,pcVar8);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
    }
    if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,local_60);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&printIndexed.defaultGenerator.arrayCount);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&fallback.fallback);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&fallback.defaultGenerator.arrayCount);
    std::__cxx11::stringstream::~stringstream((stringstream *)&module.tagsMap._M_h._M_single_bucket)
    ;
    std::ios_base::~ios_base(local_3b8);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&printDefault.defaultGenerator.arrayCount);
    ::wasm::Module::~Module((Module *)auStack_828);
    if (fallback.names._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      operator_delete(fallback.names._M_h._M_single_bucket,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)fallback.names._M_h._M_single_bucket);
    }
  }
  else {
    testing::Message::Message((Message *)&printIndexed.fallback);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_828,(internal *)&module.tagsMap._M_h._M_single_bucket,
               (AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x87,(char *)auStack_828);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&printIndexed.fallback);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if (auStack_828 !=
        (undefined1  [8])
        &module.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)auStack_828,
                      (ulong)((long)&((module.exports.
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                     .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1)
                     );
    }
    if (printIndexed.fallback != (IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *)0x0) {
      (**(code **)(((printIndexed.fallback)->defaultGenerator).funcCount + 8))();
    }
    if (_stream != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stream,_stream);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [local_1a8.
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index].
    _M_data)((anon_class_1_0_00000001 *)auStack_828,&local_1a8);
  ::wasm::TypeBuilder::~TypeBuilder
            ((TypeBuilder *)
             &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(TypeTest, ModuleTypePrinter) {
  TypeBuilder builder(2);
  builder.createRecGroup(0, 2);
  builder[0] = Struct({Field(Type::i32, Immutable)});
  builder[1] = Struct({Field(Type::i32, Immutable)});

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  Module module;
  module.typeNames[built[0]] = {"A", {}};

  ModuleTypeNameGenerator printDefault(module);

  std::stringstream stream;
  stream << printDefault(built[0]);
  EXPECT_EQ(stream.str(), "(type $A (struct (field i32)))");

  stream.str("");
  stream << printDefault(built[1]);
  EXPECT_EQ(stream.str(), "(type $struct.0 (struct (field i32)))");

  using IndexedFallback = IndexedTypeNameGenerator<DefaultTypeNameGenerator>;
  IndexedTypeNameGenerator fallback(built);
  ModuleTypeNameGenerator<IndexedFallback> printIndexed(module, fallback);

  stream.str("");
  stream << printIndexed(built[0]);
  EXPECT_EQ(stream.str(), "(type $A (struct (field i32)))");

  stream.str("");
  stream << printIndexed(built[1]);
  EXPECT_EQ(stream.str(), "(type $1 (struct (field i32)))");
}